

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall
QFutureInterfaceBase::setContinuation
          (QFutureInterfaceBase *this,QObject *context,function<void_()> *func,
          QVariant *continuationFuture,ContinuationType type)

{
  undefined1 uVar1;
  function<void_(const_QFutureInterfaceBase_&)> *func_00;
  anon_class_24_2_b535a69b_for_o *slot_00;
  void *pvVar2;
  ContextType *in_RDX;
  QFutureInterfaceBase *in_RSI;
  Object *in_RDI;
  long in_FS_OFFSET;
  QFutureInterfaceBase *continuationPtr;
  QFutureInterfaceBasePrivate *continuationFutureData;
  QObjectContinuationWrapper *watcher;
  enable_if_t<QtPrivate::countMatchingArguments<void_(*)(),_std::function<void_()>_>()_>__0__QtPrivate__QSlotObjectBase__>
  slotObj;
  anon_class_24_2_b535a69b_for_o destroyWatcher;
  shared_ptr<QRecursiveMutex> watcherMutex;
  SlotObjUniquePtr slot;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe3c;
  anon_class_64_3_c09c7d40 *in_stack_fffffffffffffe40;
  anon_class_64_3_c09c7d40 *in_stack_fffffffffffffe48;
  function<void_()> *in_stack_fffffffffffffe50;
  function<void_(const_QFutureInterfaceBase_&)> *this_00;
  undefined8 in_stack_fffffffffffffe60;
  ContinuationType type_00;
  undefined7 in_stack_fffffffffffffe68;
  offset_in_QObjectContinuationWrapper_to_subr in_stack_fffffffffffffec0;
  ConnectionType type_01;
  function<void_(const_QFutureInterfaceBase_&)> local_48 [2];
  long local_8;
  
  type_00 = (ContinuationType)((ulong)in_stack_fffffffffffffe60 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivate::makeCallableObject<void(*)(),std::function<void()>>(in_stack_fffffffffffffe50);
  std::unique_ptr<QtPrivate::QSlotObjectBase,QtPrivate::QSlotObjectBase::Deleter>::
  unique_ptr<QtPrivate::QSlotObjectBase::Deleter,void>
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             in_stack_fffffffffffffe40,
             (pointer)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  func_00 = (function<void_(const_QFutureInterfaceBase_&)> *)operator_new(0x10);
  QObjectContinuationWrapper::QObjectContinuationWrapper
            ((QObjectContinuationWrapper *)in_stack_fffffffffffffe40,
             (QObject *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  slot_00 = (anon_class_24_2_b535a69b_for_o *)QObject::thread((QObject *)0x6e028c);
  QObject::moveToThread((QObject *)func_00,slot_00);
  std::make_shared<QRecursiveMutex>();
  std::shared_ptr<QRecursiveMutex>::shared_ptr
            (&in_stack_fffffffffffffe40->watcherMutex,
             (shared_ptr<QRecursiveMutex> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             in_stack_fffffffffffffe40,
             (unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  type_01 = 0x6e0900;
  QObject::
  connect<void(QObjectContinuationWrapper::*)(),QFutureInterfaceBase::setContinuation(QObject_const*,std::function<void()>,QVariant_const&,QFutureInterfaceBase::ContinuationType)::__0>
            ((Object *)in_RDI,in_stack_fffffffffffffec0,in_RDX,
             (anon_class_8_1_899196fc_for_o *)slot_00,0x6e0900);
  QMetaObject::Connection::~Connection((Connection *)in_stack_fffffffffffffe40);
  setContinuation(QObject_const*,std::function<void()>,QVariant_const&,QFutureInterfaceBase::ContinuationType)
  ::$_0::~__0((anon_class_8_1_899196fc_for_o *)0x6e03a8);
  QObject::
  connect<void(QObjectContinuationWrapper::*)(),QFutureInterfaceBase::setContinuation(QObject_const*,std::function<void()>,QVariant_const&,QFutureInterfaceBase::ContinuationType)::__1_const&>
            ((Object *)in_RDI,in_stack_fffffffffffffec0,in_RDX,slot_00,type_01);
  QMetaObject::Connection::~Connection((Connection *)in_stack_fffffffffffffe40);
  uVar3 = 0;
  QObject::
  connect<void(QObject::*)(QObject*),QFutureInterfaceBase::setContinuation(QObject_const*,std::function<void()>,QVariant_const&,QFutureInterfaceBase::ContinuationType)::__1_const&>
            (in_RDI,(offset_in_QObject_to_subr)QObject::destroyed,in_RDX,slot_00,type_01);
  QMetaObject::Connection::~Connection((Connection *)in_stack_fffffffffffffe40);
  uVar1 = ::QVariant::isValid((QVariant *)in_stack_fffffffffffffe40);
  if ((bool)uVar1) {
    pvVar2 = ::QVariant::constData((QVariant *)0x6e04ac);
    type_00 = (ContinuationType)((ulong)pvVar2 >> 0x38);
  }
  this_00 = local_48;
  std::shared_ptr<QRecursiveMutex>::shared_ptr
            (&in_stack_fffffffffffffe40->watcherMutex,
             (shared_ptr<QRecursiveMutex> *)CONCAT44(in_stack_fffffffffffffe3c,uVar3));
  QPointer<QObjectContinuationWrapper>::QPointer<void>
            ((QPointer<QObjectContinuationWrapper> *)in_stack_fffffffffffffe40,
             (QObjectContinuationWrapper *)CONCAT44(in_stack_fffffffffffffe3c,uVar3));
  ::QVariant::QVariant
            ((QVariant *)in_stack_fffffffffffffe40,
             (QVariant *)CONCAT44(in_stack_fffffffffffffe3c,uVar3));
  std::function<void(QFutureInterfaceBase_const&)>::
  function<QFutureInterfaceBase::setContinuation(QObject_const*,std::function<void()>,QVariant_const&,QFutureInterfaceBase::ContinuationType)::__2,void>
            (this_00,in_stack_fffffffffffffe48);
  setContinuation(in_RSI,func_00,(void *)CONCAT17(uVar1,in_stack_fffffffffffffe68),type_00);
  std::function<void_(const_QFutureInterfaceBase_&)>::~function
            ((function<void_(const_QFutureInterfaceBase_&)> *)0x6e05f8);
  setContinuation(QObject_const*,std::function<void()>,QVariant_const&,QFutureInterfaceBase::ContinuationType)
  ::$_2::~__2(in_stack_fffffffffffffe40);
  setContinuation(QObject_const*,std::function<void()>,QVariant_const&,QFutureInterfaceBase::ContinuationType)
  ::$_1::~__1((anon_class_24_2_b535a69b_for_o *)0x6e0612);
  std::shared_ptr<QRecursiveMutex>::~shared_ptr((shared_ptr<QRecursiveMutex> *)0x6e061f);
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             in_stack_fffffffffffffe40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::setContinuation(const QObject *context, std::function<void()> func,
                                           const QVariant &continuationFuture,
                                           ContinuationType type)
{
    Q_ASSERT(context);

    using FuncType = void();
    using Prototype = typename QtPrivate::Callable<FuncType>::Function;
    auto slotObj = QtPrivate::makeCallableObject<Prototype>(std::move(func));

    auto slot = QtPrivate::SlotObjUniquePtr(slotObj);

    auto *watcher = new QObjectContinuationWrapper;
    watcher->moveToThread(context->thread());

   // We need to protect acccess to the watcher. The context object (and in turn, the watcher)
   // could be destroyed while the continuation that emits the signal is running. We have to
   // prevent that.
   // The mutex has to be recursive, because the continuation itself could delete the context
   // object (and thus the watcher), which will try to lock the mutex from the same thread twice.
    auto watcherMutex = std::make_shared<QRecursiveMutex>();
    const auto destroyWatcher = [watcherMutex, watcher]() mutable {
        QMutexLocker lock(watcherMutex.get());
        delete watcher;
    };

    // ### we're missing a convenient way to `QObject::connect()` to a `QSlotObjectBase`...
    QObject::connect(watcher, &QObjectContinuationWrapper::run,
                     // for the following, cf. QMetaObject::invokeMethodImpl():
                     // we know `slot` is a lambda returning `void`, so we can just
                     // `call()` with `obj` and `args[0]` set to `nullptr`:
                     context, [slot = std::move(slot)] {
                         void *args[] = { nullptr }; // for `void` return value
                         slot->call(nullptr, args);
                     });
    QObject::connect(watcher, &QObjectContinuationWrapper::run, watcher, destroyWatcher);

    // We need to connect to destroyWatcher here, instead of delete or deleteLater().
    // If the continuation is called from a separate thread, emit watcher->run() can't detect that
    // the watcher has been deleted in the separate thread, causing a race condition and potential
    // heap-use-after-free issue inside QObject::doActivate. destroyWatcher forces the deletion of
    // the watcher to occur after emit watcher->run() completes and prevents the race condition.
    QObject::connect(context, &QObject::destroyed, watcher, destroyWatcher);

    // Extract a QFutureInterfaceBasePrivate pointer from the QVariant. We rely
    // on the fact that QVariant contains QFutureInterface<T>.
    QFutureInterfaceBasePrivate *continuationFutureData = nullptr;
    if (continuationFuture.isValid()) {
        Q_ASSERT(QLatin1StringView(continuationFuture.typeName())
                         .startsWith(QLatin1StringView("QFutureInterface")));
        const auto continuationPtr =
                static_cast<const QFutureInterfaceBase *>(continuationFuture.constData());
        continuationFutureData = continuationPtr->d;
    }

    // Capture continuationFuture so that it lives as long as the continuation,
    // and the continuation data remains valid.
    setContinuation([watcherMutex = std::move(watcherMutex),
                     watcher = QPointer(watcher), continuationFuture]
                    (const QFutureInterfaceBase &parentData)
    {
        Q_UNUSED(parentData);
        Q_UNUSED(continuationFuture);
        QMutexLocker lock(watcherMutex.get());
        if (watcher)
            emit watcher->run();
    }, continuationFutureData, type);
}